

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::UpdateTextureRegion
          (DeviceContextVkImpl *this,void *pSrcData,Uint64 SrcStride,Uint64 SrcDepthStride,
          TextureVkImpl *TextureVk,Uint32 MipLevel,Uint32 Slice,Box *DstBox,
          RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)

{
  VulkanPhysicalDevice *pVVar1;
  TextureFormatAttribs *pTVar2;
  ulong uVar3;
  ulong uVar4;
  char (*in_stack_ffffffffffffff18) [2];
  Uint64 SrcStride_local;
  Uint64 SrcDepthStride_local;
  string msg_1;
  Uint64 PlaneSize;
  BufferToTextureCopyInfo CopyInfo;
  VulkanUploadAllocation Allocation;
  
  SrcStride_local = SrcStride;
  SrcDepthStride_local = SrcDepthStride;
  if ((TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      .m_Desc.SampleCount != 1) {
    FormatString<char[73]>
              ((string *)&CopyInfo,
               (char (*) [73])
               "Only single-sample textures can be updated with vkCmdCopyBufferToImage()");
    DebugAssertionFailed
              ((Char *)CopyInfo.RowSize,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9c3);
    if ((Uint32 *)CopyInfo.RowSize != &CopyInfo.RowStrideInTexels) {
      operator_delete((void *)CopyInfo.RowSize,
                      CONCAT44(CopyInfo.RowCount,CopyInfo.RowStrideInTexels) + 1);
    }
  }
  pVVar1 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
           m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  GetBufferToTextureCopyInfo
            (&CopyInfo,
             (TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_Desc.Format,DstBox,*(Uint32 *)((long)&(pVVar1->m_Properties).limits + 0x1e8));
  uVar4 = *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x1e0);
  uVar3 = 4;
  if (4 < uVar4) {
    uVar3 = uVar4;
  }
  pTVar2 = GetTextureFormatAttribs
                     ((TextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  uVar4 = (ulong)pTVar2->ComponentSize;
  if (pTVar2->ComponentSize < uVar3) {
    uVar4 = uVar3;
  }
  if (pTVar2->ComponentType != COMPONENT_TYPE_COMPRESSED) {
    uVar4 = uVar3;
  }
  VulkanUploadHeap::Allocate(&Allocation,&this->m_UploadHeap,CopyInfo.MemorySize,uVar4);
  if (Allocation.AlignedOffset % uVar4 != 0) {
    FormatString<char[50]>
              (&msg_1,(char (*) [50])"Allocation offset must be at least 32-bit aligned");
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9d6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
      operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
    }
  }
  if (SrcStride_local < CopyInfo.RowSize) {
    FormatString<char[21],unsigned_long,char[32],unsigned_long,char[2]>
              (&msg_1,(Diligent *)"Source data stride (",(char (*) [21])&SrcStride_local,
               (unsigned_long *)") is below the image row size (",(char (*) [32])&CopyInfo,
               (unsigned_long *)0x752f31,in_stack_ffffffffffffff18);
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9da);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
      operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
    }
  }
  PlaneSize = CopyInfo.RowCount * SrcStride_local;
  if ((CopyInfo.Region.MaxZ - CopyInfo.Region.MinZ != 1) && (SrcDepthStride_local < PlaneSize)) {
    FormatString<char[27],unsigned_long,char[34],unsigned_long,char[2]>
              (&msg_1,(Diligent *)"Source data depth stride (",(char (*) [27])&SrcDepthStride_local,
               (unsigned_long *)") is below the image plane size (",(char (*) [34])&PlaneSize,
               (unsigned_long *)0x752f31,in_stack_ffffffffffffff18);
    DebugAssertionFailed
              (msg_1._M_dataplus._M_p,"UpdateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x9dc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
      operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
    }
  }
  if (CopyInfo.Region.MaxZ != CopyInfo.Region.MinZ) {
    uVar4 = 0;
    do {
      if (CopyInfo.RowCount != 0) {
        uVar3 = 0;
        do {
          memcpy((void *)((long)Allocation.CPUAddress +
                         CopyInfo.DepthStride * uVar4 + CopyInfo.RowStride * uVar3),
                 (void *)((long)pSrcData + SrcDepthStride_local * uVar4 + SrcStride_local * uVar3),
                 CopyInfo.RowSize);
          uVar3 = uVar3 + 1;
        } while (uVar3 < CopyInfo.RowCount);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != CopyInfo.Region.MaxZ - CopyInfo.Region.MinZ);
  }
  CopyBufferToTexture(this,Allocation.vkBuffer,Allocation.AlignedOffset,CopyInfo.RowStrideInTexels,
                      TextureVk,&CopyInfo.Region,MipLevel,Slice,TextureTransitionMode);
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateTextureRegion(const void*                    pSrcData,
                                              Uint64                         SrcStride,
                                              Uint64                         SrcDepthStride,
                                              TextureVkImpl&                 TextureVk,
                                              Uint32                         MipLevel,
                                              Uint32                         Slice,
                                              const Box&                     DstBox,
                                              RESOURCE_STATE_TRANSITION_MODE TextureTransitionMode)
{
    const TextureDesc& TexDesc = TextureVk.GetDesc();
    VERIFY(TexDesc.SampleCount == 1, "Only single-sample textures can be updated with vkCmdCopyBufferToImage()");

    const VkPhysicalDeviceLimits& DeviceLimits      = m_pDevice->GetPhysicalDevice().GetProperties().limits;
    const BufferToTextureCopyInfo CopyInfo          = GetBufferToTextureCopyInfo(TexDesc.Format, DstBox, static_cast<Uint32>(DeviceLimits.optimalBufferCopyRowPitchAlignment));
    const Uint32                  UpdateRegionDepth = CopyInfo.Region.Depth();

    // For UpdateTextureRegion(), use UploadHeap, not dynamic heap
    // Source buffer offset must be multiple of 4 (18.4)
    VkDeviceSize BufferOffsetAlignment = std::max(DeviceLimits.optimalBufferCopyOffsetAlignment, VkDeviceSize{4});
    // If the calling command's VkImage parameter is a compressed image, bufferOffset must be a multiple of
    // the compressed texel block size in bytes (18.4)
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
    {
        BufferOffsetAlignment = std::max(BufferOffsetAlignment, VkDeviceSize{FmtAttribs.ComponentSize});
    }
    VulkanUploadAllocation Allocation = m_UploadHeap.Allocate(CopyInfo.MemorySize, BufferOffsetAlignment);
    // The allocation will stay in the upload heap until the end of the frame at which point all upload
    // pages will be discarded
    VERIFY((Allocation.AlignedOffset % BufferOffsetAlignment) == 0, "Allocation offset must be at least 32-bit aligned");

#ifdef DILIGENT_DEBUG
    {
        VERIFY(SrcStride >= CopyInfo.RowSize, "Source data stride (", SrcStride, ") is below the image row size (", CopyInfo.RowSize, ")");
        const Uint64 PlaneSize = SrcStride * CopyInfo.RowCount;
        VERIFY(UpdateRegionDepth == 1 || SrcDepthStride >= PlaneSize, "Source data depth stride (", SrcDepthStride, ") is below the image plane size (", PlaneSize, ")");
    }
#endif
    for (Uint32 DepthSlice = 0; DepthSlice < UpdateRegionDepth; ++DepthSlice)
    {
        for (Uint32 row = 0; row < CopyInfo.RowCount; ++row)
        {
            // clang-format off
            const Uint8* pSrcPtr =
                reinterpret_cast<const Uint8*>(pSrcData)
                + row        * SrcStride
                + DepthSlice * SrcDepthStride;
            Uint8* pDstPtr =
                reinterpret_cast<Uint8*>(Allocation.CPUAddress)
                + row        * CopyInfo.RowStride
                + DepthSlice * CopyInfo.DepthStride;
            // clang-format on

            memcpy(pDstPtr, pSrcPtr, StaticCast<size_t>(CopyInfo.RowSize));
        }
    }
    CopyBufferToTexture(Allocation.vkBuffer,
                        Allocation.AlignedOffset,
                        CopyInfo.RowStrideInTexels,
                        TextureVk,
                        CopyInfo.Region,
                        MipLevel,
                        Slice,
                        TextureTransitionMode);
}